

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O0

bool __thiscall
bssl::tls13_write_psk_binder
          (bssl *this,SSL_HANDSHAKE *hs,SSLTranscript *transcript,Span<unsigned_char> msg,
          size_t *out_binder_len)

{
  long lVar1;
  Span<const_unsigned_char> client_hello;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer psVar6;
  EVP_MD *md;
  undefined4 extraout_var;
  uchar *dst;
  undefined4 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff18;
  undefined1 local_c0 [8];
  Span<unsigned_char> msg_binder;
  size_t local_a8;
  size_t local_a0;
  size_t verify_data_len;
  uint8_t verify_data [64];
  size_t binders_len;
  size_t hash_len;
  EVP_MD *digest;
  SSL *ssl;
  size_t *out_binder_len_local;
  SSLTranscript *transcript_local;
  SSL_HANDSHAKE *hs_local;
  Span<unsigned_char> msg_local;
  
  msg_local.data_ = msg.data_;
  lVar1 = *(long *)this;
  hs_local = (SSL_HANDSHAKE *)transcript;
  psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(lVar1 + 0x58));
  md = (EVP_MD *)ssl_session_get_digest(psVar6);
  iVar4 = EVP_MD_size(md);
  verify_data._56_8_ = CONCAT44(extraout_var,iVar4) + 3;
  psVar6 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                     ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)(lVar1 + 0x58));
  Span<unsigned_char_const>::Span<bssl::Span<unsigned_char>,void,bssl::Span<unsigned_char>>
            ((Span<unsigned_char_const> *)&msg_binder.size_,(Span<unsigned_char> *)&hs_local);
  uVar2 = verify_data._56_8_;
  iVar5 = SSL_is_dtls(*(SSL **)this);
  client_hello.size_._0_1_ = iVar5 != 0;
  client_hello.data_ = (uchar *)uVar2;
  client_hello.size_._1_3_ = 0;
  client_hello.size_._4_4_ = in_stack_ffffffffffffff14;
  bVar3 = tls13_psk_binder((bssl *)&verify_data_len,(uint8_t *)&local_a0,(size_t *)psVar6,
                           (SSL_SESSION *)hs,(SSLTranscript *)msg_binder.size_,client_hello,local_a8
                           ,(bool)in_stack_ffffffffffffff18);
  if ((bVar3) && (local_a0 == CONCAT44(extraout_var,iVar4))) {
    _local_c0 = Span<unsigned_char>::last((Span<unsigned_char> *)&hs_local,local_a0);
    dst = Span<unsigned_char>::data((Span<unsigned_char> *)local_c0);
    ::OPENSSL_memcpy(dst,&verify_data_len,local_a0);
    if ((size_t *)msg.size_ != (size_t *)0x0) {
      *(size_t *)msg.size_ = local_a0;
    }
    msg_local.size_._7_1_ = true;
  }
  else {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_enc.cc"
                  ,0x253);
    msg_local.size_._7_1_ = false;
  }
  return msg_local.size_._7_1_;
}

Assistant:

bool tls13_write_psk_binder(const SSL_HANDSHAKE *hs,
                            const SSLTranscript &transcript, Span<uint8_t> msg,
                            size_t *out_binder_len) {
  const SSL *const ssl = hs->ssl;
  const EVP_MD *digest = ssl_session_get_digest(ssl->session.get());
  const size_t hash_len = EVP_MD_size(digest);
  // We only offer one PSK, so the binders are a u16 and u8 length
  // prefix, followed by the binder. The caller is assumed to have constructed
  // |msg| with placeholder binders.
  const size_t binders_len = 3 + hash_len;
  uint8_t verify_data[EVP_MAX_MD_SIZE];
  size_t verify_data_len;
  if (!tls13_psk_binder(verify_data, &verify_data_len, ssl->session.get(),
                        transcript, msg, binders_len, SSL_is_dtls(hs->ssl)) ||
      verify_data_len != hash_len) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  auto msg_binder = msg.last(verify_data_len);
  OPENSSL_memcpy(msg_binder.data(), verify_data, verify_data_len);
  if (out_binder_len != nullptr) {
    *out_binder_len = verify_data_len;
  }
  return true;
}